

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_blas2.c
# Opt level: O0

int sp_ctrsv(char *uplo,char *trans,char *diag,SuperMatrix *L,SuperMatrix *U,singlecomplex *x,
            SuperLUStat_t *stat,int *info)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  void *pvVar4;
  long lVar5;
  singlecomplex sVar6;
  int iVar7;
  singlecomplex *Mxvec;
  float ci_6;
  float cr_6;
  float ci_5;
  float cr_5;
  float ci_4;
  float cr_4;
  float ci_3;
  float cr_3;
  float ci_2;
  float cr_2;
  float ci_1;
  float cr_1;
  float ci;
  float cr;
  char msg [256];
  int ii;
  flops_t solve_ops;
  singlecomplex *work;
  int local_b0;
  int_t iptr;
  int_t k;
  int_t i;
  int_t istart;
  int_t luptr;
  int nsupc;
  int nsupr;
  int fsupc;
  int jcol;
  int irow;
  int nrow;
  singlecomplex comp_zero;
  singlecomplex beta;
  singlecomplex alpha;
  singlecomplex temp;
  int incy;
  int incx;
  singlecomplex *Uval;
  singlecomplex *Lval;
  NCformat *Ustore;
  SCformat *Lstore;
  singlecomplex *x_local;
  SuperMatrix *U_local;
  SuperMatrix *L_local;
  char *diag_local;
  char *trans_local;
  char *uplo_local;
  
  temp.i = 1.4013e-45;
  temp.r = 1.4013e-45;
  comp_zero.r = 1.0;
  comp_zero.i = 0.0;
  memset(&irow,0,8);
  *info = 0;
  iVar7 = strncmp(uplo,"L",1);
  if ((iVar7 == 0) || (iVar7 = strncmp(uplo,"U",1), iVar7 == 0)) {
    iVar7 = strncmp(trans,"N",1);
    if ((iVar7 == 0) ||
       ((iVar7 = strncmp(trans,"T",1), iVar7 == 0 || (iVar7 = strncmp(trans,"C",1), iVar7 == 0)))) {
      iVar7 = strncmp(diag,"U",1);
      if ((iVar7 == 0) || (iVar7 = strncmp(diag,"N",1), iVar7 == 0)) {
        if ((L->nrow == L->ncol) && (-1 < L->nrow)) {
          if ((U->nrow != U->ncol) || (U->nrow < 0)) {
            *info = -5;
          }
        }
        else {
          *info = -4;
        }
      }
      else {
        *info = -3;
      }
    }
    else {
      *info = -2;
    }
  }
  else {
    *info = -1;
  }
  if (*info == 0) {
    pvVar2 = L->Store;
    lVar3 = *(long *)((long)pvVar2 + 8);
    pvVar4 = U->Store;
    lVar5 = *(long *)((long)pvVar4 + 8);
    msg[0xfc] = '\0';
    msg[0xfd] = '\0';
    msg[0xfe] = '\0';
    msg[0xff] = '\0';
    Mxvec = singlecomplexCalloc((long)L->nrow);
    if (Mxvec == (singlecomplex *)0x0) {
      sprintf((char *)&ci,"%s at line %d in file %s\n","Malloc fails for work in sp_ctrsv().",0x81,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/csp_blas2.c"
             );
      superlu_abort_and_exit((char *)&ci);
    }
    iVar7 = strncmp(trans,"N",1);
    if (iVar7 == 0) {
      iVar7 = strncmp(uplo,"L",1);
      if (iVar7 == 0) {
        if (L->nrow == 0) {
          return 0;
        }
        for (local_b0 = 0; local_b0 <= *(int *)((long)pvVar2 + 4); local_b0 = local_b0 + 1) {
          nsupc = *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)local_b0 * 4);
          work._4_4_ = *(int *)(*(long *)((long)pvVar2 + 0x20) + (long)nsupc * 4);
          luptr = *(int *)(*(long *)((long)pvVar2 + 0x20) + (long)(nsupc + 1) * 4) - work._4_4_;
          istart = *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)(local_b0 + 1) * 4) - nsupc;
          i = *(int *)(*(long *)((long)pvVar2 + 0x10) + (long)nsupc * 4);
          jcol = luptr - istart;
          msg._252_4_ = (float)(jcol * 8 * istart) +
                        (float)(istart * 4 * (istart + -1) + istart * 10) + (float)msg._252_4_;
          if (istart == 1) {
            while (work._4_4_ = work._4_4_ + 1,
                  work._4_4_ < *(int *)(*(long *)((long)pvVar2 + 0x20) + (long)(nsupc + 1) * 4)) {
              fsupc = *(int *)(*(long *)((long)pvVar2 + 0x18) + (long)work._4_4_ * 4);
              i = i + 1;
              irow = (int)(x[nsupc].r * *(float *)(lVar3 + (long)i * 8) +
                          -(x[nsupc].i * *(float *)(lVar3 + 4 + (long)i * 8)));
              nrow = (int)(x[nsupc].i * *(float *)(lVar3 + (long)i * 8) +
                          x[nsupc].r * *(float *)(lVar3 + 4 + (long)i * 8));
              x[fsupc].r = x[fsupc].r - (float)irow;
              x[fsupc].i = x[fsupc].i - (float)nrow;
            }
          }
          else {
            clsolve(luptr,istart,(singlecomplex *)(lVar3 + (long)i * 8),x + nsupc);
            cmatvec(luptr,luptr - istart,istart,(singlecomplex *)(lVar3 + (long)(i + istart) * 8),
                    x + nsupc,Mxvec);
            work._4_4_ = work._4_4_ + istart;
            for (iptr = 0; iptr < jcol; iptr = iptr + 1) {
              fsupc = *(int *)(*(long *)((long)pvVar2 + 0x18) + (long)work._4_4_ * 4);
              x[fsupc].r = x[fsupc].r - Mxvec[iptr].r;
              x[fsupc].i = x[fsupc].i - Mxvec[iptr].i;
              sVar6.i = (float)nrow;
              sVar6.r = (float)irow;
              Mxvec[iptr] = sVar6;
              work._4_4_ = work._4_4_ + 1;
            }
          }
        }
      }
      else {
        if (U->nrow == 0) {
          return 0;
        }
        for (local_b0 = *(int *)((long)pvVar2 + 4); -1 < local_b0; local_b0 = local_b0 + -1) {
          nsupc = *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)local_b0 * 4);
          luptr = *(int *)(*(long *)((long)pvVar2 + 0x20) + (long)(nsupc + 1) * 4) -
                  *(int *)(*(long *)((long)pvVar2 + 0x20) + (long)nsupc * 4);
          istart = *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)(local_b0 + 1) * 4) - nsupc;
          iVar7 = *(int *)(*(long *)((long)pvVar2 + 0x10) + (long)nsupc * 4);
          msg._252_4_ = (float)(istart * 4 * (istart + 1) + istart * 10) + (float)msg._252_4_;
          if (istart == 1) {
            c_div(x + nsupc,x + nsupc,(singlecomplex *)(lVar3 + (long)iVar7 * 8));
            for (iptr = *(int_t *)(*(long *)((long)pvVar4 + 0x18) + (long)nsupc * 4);
                iptr < *(int *)(*(long *)((long)pvVar4 + 0x18) + (long)(nsupc + 1) * 4);
                iptr = iptr + 1) {
              fsupc = *(int *)(*(long *)((long)pvVar4 + 0x10) + (long)iptr * 4);
              irow = (int)(x[nsupc].r * *(float *)(lVar5 + (long)iptr * 8) +
                          -(x[nsupc].i * *(float *)(lVar5 + 4 + (long)iptr * 8)));
              nrow = (int)(x[nsupc].i * *(float *)(lVar5 + (long)iptr * 8) +
                          x[nsupc].r * *(float *)(lVar5 + 4 + (long)iptr * 8));
              x[fsupc].r = x[fsupc].r - (float)irow;
              x[fsupc].i = x[fsupc].i - (float)nrow;
            }
          }
          else {
            cusolve(luptr,istart,(singlecomplex *)(lVar3 + (long)iVar7 * 8),x + nsupc);
            for (nsupr = nsupc;
                nsupr < *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)(local_b0 + 1) * 4);
                nsupr = nsupr + 1) {
              msg._252_4_ = (float)((*(int *)(*(long *)((long)pvVar4 + 0x18) + (long)(nsupr + 1) * 4
                                             ) -
                                    *(int *)(*(long *)((long)pvVar4 + 0x18) + (long)nsupr * 4)) * 8)
                            + (float)msg._252_4_;
              for (iptr = *(int_t *)(*(long *)((long)pvVar4 + 0x18) + (long)nsupr * 4);
                  iptr < *(int *)(*(long *)((long)pvVar4 + 0x18) + (long)(nsupr + 1) * 4);
                  iptr = iptr + 1) {
                fsupc = *(int *)(*(long *)((long)pvVar4 + 0x10) + (long)iptr * 4);
                irow = (int)(x[nsupr].r * *(float *)(lVar5 + (long)iptr * 8) +
                            -(x[nsupr].i * *(float *)(lVar5 + 4 + (long)iptr * 8)));
                nrow = (int)(x[nsupr].i * *(float *)(lVar5 + (long)iptr * 8) +
                            x[nsupr].r * *(float *)(lVar5 + 4 + (long)iptr * 8));
                x[fsupc].r = x[fsupc].r - (float)irow;
                x[fsupc].i = x[fsupc].i - (float)nrow;
              }
            }
          }
        }
      }
    }
    else {
      iVar7 = strncmp(trans,"T",1);
      if (iVar7 == 0) {
        iVar7 = strncmp(uplo,"L",1);
        if (iVar7 == 0) {
          if (L->nrow == 0) {
            return 0;
          }
          for (local_b0 = *(int *)((long)pvVar2 + 4); -1 < local_b0; local_b0 = local_b0 + -1) {
            nsupc = *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)local_b0 * 4);
            iVar7 = *(int *)(*(long *)((long)pvVar2 + 0x20) + (long)nsupc * 4);
            luptr = *(int *)(*(long *)((long)pvVar2 + 0x20) + (long)(nsupc + 1) * 4) - iVar7;
            istart = *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)(local_b0 + 1) * 4) - nsupc;
            iVar1 = *(int *)(*(long *)((long)pvVar2 + 0x10) + (long)nsupc * 4);
            msg._252_4_ = (float)((luptr - istart) * 8 * istart) + (float)msg._252_4_;
            for (nsupr = nsupc;
                nsupr < *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)(local_b0 + 1) * 4);
                nsupr = nsupr + 1) {
              work._4_4_ = iVar7 + istart;
              for (iptr = *(int *)(*(long *)((long)pvVar2 + 0x10) + (long)nsupr * 4) + istart;
                  iptr < *(int *)(*(long *)((long)pvVar2 + 0x10) + (long)(nsupr + 1) * 4);
                  iptr = iptr + 1) {
                fsupc = *(int *)(*(long *)((long)pvVar2 + 0x18) + (long)work._4_4_ * 4);
                irow = (int)(x[fsupc].r * *(float *)(lVar3 + (long)iptr * 8) +
                            -(x[fsupc].i * *(float *)(lVar3 + 4 + (long)iptr * 8)));
                nrow = (int)(x[fsupc].i * *(float *)(lVar3 + (long)iptr * 8) +
                            x[fsupc].r * *(float *)(lVar3 + 4 + (long)iptr * 8));
                x[nsupr].r = x[nsupr].r - (float)irow;
                x[nsupr].i = x[nsupr].i - (float)nrow;
                work._4_4_ = work._4_4_ + 1;
              }
            }
            if (1 < istart) {
              msg._252_4_ = (float)(istart * 4 * (istart + -1)) + (float)msg._252_4_;
              ctrsv_("L","T","U",&istart,(singlecomplex *)(lVar3 + (long)iVar1 * 8),&luptr,x + nsupc
                     ,(integer *)&temp.i);
            }
          }
        }
        else {
          if (U->nrow == 0) {
            return 0;
          }
          for (local_b0 = 0; local_b0 <= *(int *)((long)pvVar2 + 4); local_b0 = local_b0 + 1) {
            nsupc = *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)local_b0 * 4);
            luptr = *(int *)(*(long *)((long)pvVar2 + 0x20) + (long)(nsupc + 1) * 4) -
                    *(int *)(*(long *)((long)pvVar2 + 0x20) + (long)nsupc * 4);
            istart = *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)(local_b0 + 1) * 4) - nsupc;
            iVar7 = *(int *)(*(long *)((long)pvVar2 + 0x10) + (long)nsupc * 4);
            for (nsupr = nsupc;
                nsupr < *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)(local_b0 + 1) * 4);
                nsupr = nsupr + 1) {
              msg._252_4_ = (float)((*(int *)(*(long *)((long)pvVar4 + 0x18) + (long)(nsupr + 1) * 4
                                             ) -
                                    *(int *)(*(long *)((long)pvVar4 + 0x18) + (long)nsupr * 4)) * 8)
                            + (float)msg._252_4_;
              for (iptr = *(int_t *)(*(long *)((long)pvVar4 + 0x18) + (long)nsupr * 4);
                  iptr < *(int *)(*(long *)((long)pvVar4 + 0x18) + (long)(nsupr + 1) * 4);
                  iptr = iptr + 1) {
                fsupc = *(int *)(*(long *)((long)pvVar4 + 0x10) + (long)iptr * 4);
                irow = (int)(x[fsupc].r * *(float *)(lVar5 + (long)iptr * 8) +
                            -(x[fsupc].i * *(float *)(lVar5 + 4 + (long)iptr * 8)));
                nrow = (int)(x[fsupc].i * *(float *)(lVar5 + (long)iptr * 8) +
                            x[fsupc].r * *(float *)(lVar5 + 4 + (long)iptr * 8));
                x[nsupr].r = x[nsupr].r - (float)irow;
                x[nsupr].i = x[nsupr].i - (float)nrow;
              }
            }
            msg._252_4_ = (float)(istart * 4 * (istart + 1) + istart * 10) + (float)msg._252_4_;
            if (istart == 1) {
              c_div(x + nsupc,x + nsupc,(singlecomplex *)(lVar3 + (long)iVar7 * 8));
            }
            else {
              ctrsv_("U","T","N",&istart,(singlecomplex *)(lVar3 + (long)iVar7 * 8),&luptr,x + nsupc
                     ,(integer *)&temp.i);
            }
          }
        }
      }
      else {
        iVar7 = strncmp(uplo,"L",1);
        if (iVar7 == 0) {
          if (L->nrow == 0) {
            return 0;
          }
          for (local_b0 = *(int *)((long)pvVar2 + 4); -1 < local_b0; local_b0 = local_b0 + -1) {
            nsupc = *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)local_b0 * 4);
            iVar7 = *(int *)(*(long *)((long)pvVar2 + 0x20) + (long)nsupc * 4);
            luptr = *(int *)(*(long *)((long)pvVar2 + 0x20) + (long)(nsupc + 1) * 4) - iVar7;
            istart = *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)(local_b0 + 1) * 4) - nsupc;
            iVar1 = *(int *)(*(long *)((long)pvVar2 + 0x10) + (long)nsupc * 4);
            msg._252_4_ = (float)((luptr - istart) * 8 * istart) + (float)msg._252_4_;
            for (nsupr = nsupc;
                nsupr < *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)(local_b0 + 1) * 4);
                nsupr = nsupr + 1) {
              work._4_4_ = iVar7 + istart;
              for (iptr = *(int *)(*(long *)((long)pvVar2 + 0x10) + (long)nsupr * 4) + istart;
                  iptr < *(int *)(*(long *)((long)pvVar2 + 0x10) + (long)(nsupr + 1) * 4);
                  iptr = iptr + 1) {
                fsupc = *(int *)(*(long *)((long)pvVar2 + 0x18) + (long)work._4_4_ * 4);
                alpha.r = *(float *)(lVar3 + (long)iptr * 8);
                alpha.i = -*(float *)(lVar3 + 4 + (long)iptr * 8);
                irow = (int)(x[fsupc].r * alpha.r + -(x[fsupc].i * alpha.i));
                nrow = (int)(x[fsupc].i * alpha.r + x[fsupc].r * alpha.i);
                x[nsupr].r = x[nsupr].r - (float)irow;
                x[nsupr].i = x[nsupr].i - (float)nrow;
                work._4_4_ = work._4_4_ + 1;
              }
            }
            if (1 < istart) {
              msg._252_4_ = (float)(istart * 4 * (istart + -1)) + (float)msg._252_4_;
              ctrsv_("L",trans,"U",&istart,(singlecomplex *)(lVar3 + (long)iVar1 * 8),&luptr,
                     x + nsupc,(integer *)&temp.i);
            }
          }
        }
        else {
          if (U->nrow == 0) {
            return 0;
          }
          for (local_b0 = 0; local_b0 <= *(int *)((long)pvVar2 + 4); local_b0 = local_b0 + 1) {
            nsupc = *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)local_b0 * 4);
            luptr = *(int *)(*(long *)((long)pvVar2 + 0x20) + (long)(nsupc + 1) * 4) -
                    *(int *)(*(long *)((long)pvVar2 + 0x20) + (long)nsupc * 4);
            istart = *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)(local_b0 + 1) * 4) - nsupc;
            iVar7 = *(int *)(*(long *)((long)pvVar2 + 0x10) + (long)nsupc * 4);
            for (nsupr = nsupc;
                nsupr < *(int *)(*(long *)((long)pvVar2 + 0x30) + (long)(local_b0 + 1) * 4);
                nsupr = nsupr + 1) {
              msg._252_4_ = (float)((*(int *)(*(long *)((long)pvVar4 + 0x18) + (long)(nsupr + 1) * 4
                                             ) -
                                    *(int *)(*(long *)((long)pvVar4 + 0x18) + (long)nsupr * 4)) * 8)
                            + (float)msg._252_4_;
              for (iptr = *(int_t *)(*(long *)((long)pvVar4 + 0x18) + (long)nsupr * 4);
                  iptr < *(int *)(*(long *)((long)pvVar4 + 0x18) + (long)(nsupr + 1) * 4);
                  iptr = iptr + 1) {
                fsupc = *(int *)(*(long *)((long)pvVar4 + 0x10) + (long)iptr * 4);
                alpha.r = *(float *)(lVar5 + (long)iptr * 8);
                alpha.i = -*(float *)(lVar5 + 4 + (long)iptr * 8);
                irow = (int)(x[fsupc].r * alpha.r + -(x[fsupc].i * alpha.i));
                nrow = (int)(x[fsupc].i * alpha.r + x[fsupc].r * alpha.i);
                x[nsupr].r = x[nsupr].r - (float)irow;
                x[nsupr].i = x[nsupr].i - (float)nrow;
              }
            }
            msg._252_4_ = (float)(istart * 4 * (istart + 1) + istart * 10) + (float)msg._252_4_;
            if (istart == 1) {
              alpha.r = *(float *)(lVar3 + (long)iVar7 * 8);
              alpha.i = -*(float *)(lVar3 + 4 + (long)iVar7 * 8);
              c_div(x + nsupc,x + nsupc,&alpha);
            }
            else {
              ctrsv_("U",trans,"N",&istart,(singlecomplex *)(lVar3 + (long)iVar7 * 8),&luptr,
                     x + nsupc,(integer *)&temp.i);
            }
          }
        }
      }
    }
    stat->ops[0x11] = (float)msg._252_4_ + stat->ops[0x11];
    superlu_free(Mxvec);
    return 0;
  }
  msg._248_4_ = -*info;
  input_error("sp_ctrsv",(int *)(msg + 0xf8));
  return 0;
}

Assistant:

int
sp_ctrsv(char *uplo, char *trans, char *diag, SuperMatrix *L, 
         SuperMatrix *U, singlecomplex *x, SuperLUStat_t *stat, int *info)
{
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
	 ftcs2 = _cptofcd("N", strlen("N")),
	 ftcs3 = _cptofcd("U", strlen("U"));
#endif
    SCformat *Lstore;
    NCformat *Ustore;
    singlecomplex   *Lval, *Uval;
    int incx = 1, incy = 1;
    singlecomplex temp;
    singlecomplex alpha = {1.0, 0.0}, beta = {1.0, 0.0};
    singlecomplex comp_zero = {0.0, 0.0};
    int nrow, irow, jcol;
    int fsupc, nsupr, nsupc;
    int_t luptr, istart, i, k, iptr;
    singlecomplex *work;
    flops_t solve_ops;

    /* Test the input parameters */
    *info = 0;
    if ( strncmp(uplo,"L", 1)!=0 && strncmp(uplo, "U", 1)!=0 ) *info = -1;
    else if ( strncmp(trans, "N", 1)!=0 && strncmp(trans, "T", 1)!=0 && 
              strncmp(trans, "C", 1)!=0) *info = -2;
    else if ( strncmp(diag, "U", 1)!=0 && strncmp(diag, "N", 1)!=0 )
         *info = -3;
    else if ( L->nrow != L->ncol || L->nrow < 0 ) *info = -4;
    else if ( U->nrow != U->ncol || U->nrow < 0 ) *info = -5;
    if ( *info ) {
	int ii = -(*info);
	input_error("sp_ctrsv", &ii);
	return 0;
    }

    Lstore = L->Store;
    Lval = Lstore->nzval;
    Ustore = U->Store;
    Uval = Ustore->nzval;
    solve_ops = 0;

    if ( !(work = singlecomplexCalloc(L->nrow)) )
	ABORT("Malloc fails for work in sp_ctrsv().");
    
    if ( strncmp(trans, "N", 1)==0 ) {	/* Form x := inv(A)*x. */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := inv(L)*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
		fsupc = L_FST_SUPC(k);
		istart = L_SUB_START(fsupc);
		nsupr = L_SUB_START(fsupc+1) - istart;
		nsupc = L_FST_SUPC(k+1) - fsupc;
		luptr = L_NZ_START(fsupc);
		nrow = nsupr - nsupc;

                /* 1 c_div costs 10 flops */
	        solve_ops += 4 * nsupc * (nsupc - 1) + 10 * nsupc;
	        solve_ops += 8 * nrow * nsupc;

		if ( nsupc == 1 ) {
		    for (iptr=istart+1; iptr < L_SUB_START(fsupc+1); ++iptr) {
			irow = L_SUB(iptr);
			++luptr;
			cc_mult(&comp_zero, &x[fsupc], &Lval[luptr]);
			c_sub(&x[irow], &x[irow], &comp_zero);
		    }
		} else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
		       	&x[fsupc], &incx);
		
		    CGEMV(ftcs2, &nrow, &nsupc, &alpha, &Lval[luptr+nsupc], 
		       	&nsupr, &x[fsupc], &incx, &beta, &work[0], &incy);
#else
		    ctrsv_("L", "N", "U", &nsupc, &Lval[luptr], &nsupr,
		       	&x[fsupc], &incx);
		
		    cgemv_("N", &nrow, &nsupc, &alpha, &Lval[luptr+nsupc], 
		       	&nsupr, &x[fsupc], &incx, &beta, &work[0], &incy);
#endif
#else
		    clsolve ( nsupr, nsupc, &Lval[luptr], &x[fsupc]);
		
		    cmatvec ( nsupr, nsupr-nsupc, nsupc, &Lval[luptr+nsupc],
                             &x[fsupc], &work[0] );
#endif		
		
		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; ++i, ++iptr) {
			irow = L_SUB(iptr);
			c_sub(&x[irow], &x[irow], &work[i]); /* Scatter */
			work[i] = comp_zero;

		    }
	 	}
	    } /* for k ... */
	    
	} else {
	    /* Form x := inv(U)*x */
	    
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; k--) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);
		
                /* 1 c_div costs 10 flops */
    	        solve_ops += 4 * nsupc * (nsupc + 1) + 10 * nsupc;

		if ( nsupc == 1 ) {
		    c_div(&x[fsupc], &x[fsupc], &Lval[luptr]);
		    for (i = U_NZ_START(fsupc); i < U_NZ_START(fsupc+1); ++i) {
			irow = U_SUB(i);
			cc_mult(&comp_zero, &x[fsupc], &Uval[i]);
			c_sub(&x[irow], &x[irow], &comp_zero);
		    }
		} else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    CTRSV(ftcs3, ftcs2, ftcs2, &nsupc, &Lval[luptr], &nsupr,
		       &x[fsupc], &incx);
#else
		    ctrsv_("U", "N", "N", &nsupc, &Lval[luptr], &nsupr,
                           &x[fsupc], &incx);
#endif
#else		
		    cusolve ( nsupr, nsupc, &Lval[luptr], &x[fsupc] );
#endif		

		    for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		        solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    	for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); 
				i++) {
			    irow = U_SUB(i);
			cc_mult(&comp_zero, &x[jcol], &Uval[i]);
			c_sub(&x[irow], &x[irow], &comp_zero);
		    	}
                    }
		}
	    } /* for k ... */
	    
	}
    } else if ( strncmp(trans, "T", 1)==0 ) { /* Form x := inv(A')*x */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := inv(L')*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; --k) {
	    	fsupc = L_FST_SUPC(k);
	    	istart = L_SUB_START(fsupc);
	    	nsupr = L_SUB_START(fsupc+1) - istart;
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		solve_ops += 8 * (nsupr - nsupc) * nsupc;

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    iptr = istart + nsupc;
		    for (i = L_NZ_START(jcol) + nsupc; 
				i < L_NZ_START(jcol+1); i++) {
			irow = L_SUB(iptr);
			cc_mult(&comp_zero, &x[irow], &Lval[i]);
		    	c_sub(&x[jcol], &x[jcol], &comp_zero);
			iptr++;
		    }
		}
		
		if ( nsupc > 1 ) {
		    solve_ops += 4 * nsupc * (nsupc - 1);
#ifdef _CRAY
                    ftcs1 = _cptofcd("L", strlen("L"));
                    ftcs2 = _cptofcd("T", strlen("T"));
                    ftcs3 = _cptofcd("U", strlen("U"));
		    CTRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#else
		    ctrsv_("L", "T", "U", &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#endif
		}
	    }
	} else {
	    /* Form x := inv(U')*x */
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++) {
			irow = U_SUB(i);
			cc_mult(&comp_zero, &x[irow], &Uval[i]);
		    	c_sub(&x[jcol], &x[jcol], &comp_zero);
		    }
		}

                /* 1 c_div costs 10 flops */
		solve_ops += 4 * nsupc * (nsupc + 1) + 10 * nsupc;

		if ( nsupc == 1 ) {
		    c_div(&x[fsupc], &x[fsupc], &Lval[luptr]);
		} else {
#ifdef _CRAY
                    ftcs1 = _cptofcd("U", strlen("U"));
                    ftcs2 = _cptofcd("T", strlen("T"));
                    ftcs3 = _cptofcd("N", strlen("N"));
		    CTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#else
		    ctrsv_("U", "T", "N", &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#endif
		}
	    } /* for k ... */
	}
    } else { /* Form x := conj(inv(A'))*x */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := conj(inv(L'))*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; --k) {
	    	fsupc = L_FST_SUPC(k);
	    	istart = L_SUB_START(fsupc);
	    	nsupr = L_SUB_START(fsupc+1) - istart;
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		solve_ops += 8 * (nsupr - nsupc) * nsupc;

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    iptr = istart + nsupc;
		    for (i = L_NZ_START(jcol) + nsupc; 
				i < L_NZ_START(jcol+1); i++) {
			irow = L_SUB(iptr);
                        cc_conj(&temp, &Lval[i]);
			cc_mult(&comp_zero, &x[irow], &temp);
		    	c_sub(&x[jcol], &x[jcol], &comp_zero);
			iptr++;
		    }
 		}
 		
 		if ( nsupc > 1 ) {
		    solve_ops += 4 * nsupc * (nsupc - 1);
#ifdef _CRAY
                    ftcs1 = _cptofcd("L", strlen("L"));
                    ftcs2 = _cptofcd(trans, strlen("T"));
                    ftcs3 = _cptofcd("U", strlen("U"));
		    CTRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#else
                    ctrsv_("L", trans, "U", &nsupc, &Lval[luptr], &nsupr,
                           &x[fsupc], &incx);
#endif
		}
	    }
	} else {
	    /* Form x := conj(inv(U'))*x */
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++) {
			irow = U_SUB(i);
                        cc_conj(&temp, &Uval[i]);
			cc_mult(&comp_zero, &x[irow], &temp);
		    	c_sub(&x[jcol], &x[jcol], &comp_zero);
		    }
		}

                /* 1 c_div costs 10 flops */
		solve_ops += 4 * nsupc * (nsupc + 1) + 10 * nsupc;
 
		if ( nsupc == 1 ) {
                    cc_conj(&temp, &Lval[luptr]);
		    c_div(&x[fsupc], &x[fsupc], &temp);
		} else {
#ifdef _CRAY
                    ftcs1 = _cptofcd("U", strlen("U"));
                    ftcs2 = _cptofcd(trans, strlen("T"));
                    ftcs3 = _cptofcd("N", strlen("N"));
		    CTRSV( ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#else
                    ctrsv_("U", trans, "N", &nsupc, &Lval[luptr], &nsupr,
                               &x[fsupc], &incx);
#endif
  		}
  	    } /* for k ... */
  	}
    }

    stat->ops[SOLVE] += solve_ops;
    SUPERLU_FREE(work);
    return 0;
}